

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void usage(void)

{
  fprintf(_stderr,"usage: %s [options] archive [file ... file]\n",ourname);
  fwrite("       where options are:\n",0x1a,1,_stderr);
  fwrite("       -u or -x unarchive           -t test archive integrity\n",0x3e,1,_stderr);
  fwrite("       -l list archive contents     -q quiet\n",0x2d,1,_stderr);
  fwrite("       -f force file overwrite      -s no filestamp\n",0x34,1,_stderr);
  fwrite("       -v verbose                   -V display version number\n",0x3e,1,_stderr);
  fwrite("       -R retry if archive corrupt  -L<name> set logfile name\n",0x3e,1,_stderr);
  fwrite("       -T append filetype to name   -C create lowercase filenames\n",0x42,1,_stderr);
  fwrite("       -I unarchive with .inf files -p<password> set password\n",0x3e,1,_stderr);
  fwrite("       -c extract files to stdout\n",0x22,1,_stderr);
  exit(1);
}

Assistant:

void
usage() 
{
	fprintf(stderr, "usage: %s [options] archive [file ... file]\n",
			 ourname);
	fprintf(stderr, "       where options are:\n");
	fprintf(stderr,
			 "       -u or -x unarchive           -t test archive integrity\n");
	fprintf(stderr, "       -l list archive contents     -q quiet\n");
	fprintf(stderr,
			 "       -f force file overwrite      -s no filestamp\n");
	fprintf(stderr,
			 "       -v verbose                   -V display version number\n");
	fprintf(stderr,
			 "       -R retry if archive corrupt  -L<name> set logfile name\n");
	fprintf(stderr,
			 "       -T append filetype to name   -C create lowercase filenames\n");
	
		/* MU added instuctions for the -I option */ 
	fprintf(stderr, "       -I unarchive with .inf files -p<password> set password\n");
	fprintf(stderr, "       -c extract files to stdout\n");
	exit(1);
}